

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::writeText(XmlWriter *this,string *text,bool indent)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  bool tagWasOpen;
  bool indent_local;
  string *text_local;
  XmlWriter *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = this->m_tagIsOpen;
    ensureTagClosed(this);
    if (((bVar1 & 1U) != 0) && (indent)) {
      poVar3 = stream(this);
      std::operator<<((ostream *)poVar3,(string *)&this->m_indent);
    }
    writeEncodedText(this,text);
    this->m_needsNewline = true;
  }
  return this;
}

Assistant:

XmlWriter& writeText( std::string const& text, bool indent = true ) {
            if( !text.empty() ){
                bool tagWasOpen = m_tagIsOpen;
                ensureTagClosed();
                if( tagWasOpen && indent )
                    stream() << m_indent;
                writeEncodedText( text );
                m_needsNewline = true;
            }
            return *this;
        }